

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void free_mob_index(MOB_INDEX_DATA *pMob)

{
  MOB_INDEX_DATA *in_RDI;
  
  free_pstring((char *)pMob);
  free_pstring((char *)pMob);
  free_pstring((char *)pMob);
  free_pstring((char *)pMob);
  free_shop(in_RDI->pShop);
  in_RDI->next = mob_index_free;
  mob_index_free = in_RDI;
  return;
}

Assistant:

void free_mob_index(MOB_INDEX_DATA *pMob)
{
	free_pstring(pMob->player_name);
	free_pstring(pMob->short_descr);
	free_pstring(pMob->long_descr);
	free_pstring(pMob->description);

	free_shop(pMob->pShop);

	pMob->next = mob_index_free;
	mob_index_free = pMob;
}